

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# licensecc.cpp
# Opt level: O2

LCC_EVENT_TYPE
acquire_license(CallerInformations *callerInformation,LicenseLocation *licenseLocation,
               LicenseInfo *license_out)

{
  char *szptr;
  FUNCTION_RETURN FVar1;
  size_t sVar2;
  AuditEvent_conflict *pAVar3;
  LCC_EVENT_TYPE LVar4;
  vector<LicenseInfo,_std::allocator<LicenseInfo>_> *pvVar5;
  pointer licInfo;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenses;
  vector<LicenseInfo,_std::allocator<LicenseInfo>_> licenses_ok;
  vector<LicenseInfo,_std::allocator<LicenseInfo>_> licenses_with_errors;
  LicenseVerifier verifier;
  LicenseReader lr;
  string project;
  EventRegistry er;
  string evlog;
  
  license::LicenseReader::LicenseReader(&lr,licenseLocation);
  licenses.super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  project._M_dataplus._M_p = (pointer)&project.field_2;
  project._M_string_length = 0;
  licenses.super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  licenses.super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  project.field_2._M_local_buf[0] = '\0';
  if (callerInformation != (CallerInformations *)0x0) {
    szptr = callerInformation->feature_name;
    sVar2 = license::mstrnlen_s(szptr,0x10);
    if (sVar2 != 0) {
      evlog._M_dataplus._M_p = (pointer)&evlog.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&evlog,szptr,szptr + sVar2);
      goto LAB_0016e1e1;
    }
  }
  std::__cxx11::string::string((string *)&evlog,"DEFAULT",(allocator *)&er);
LAB_0016e1e1:
  std::__cxx11::string::operator=((string *)&project,(string *)&evlog);
  std::__cxx11::string::~string((string *)&evlog);
  std::__cxx11::string::string((string *)&evlog,(string *)&project);
  license::LicenseReader::readLicenses(&er,&lr,&evlog,&licenses);
  std::__cxx11::string::~string((string *)&evlog);
  if (licenses.
      super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      licenses.
      super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    license::EventRegistry::turnWarningsIntoErrors(&er);
    pAVar3 = license::EventRegistry::getLastFailure(&er);
    LVar4 = pAVar3->event_type;
    if (license_out != (LicenseInfo *)0x0) {
      license_out->proprietary_data[0] = '\0';
      license_out->linked_to_pc = false;
      license_out->days_left = 0;
    }
  }
  else {
    licenses_with_errors.super__Vector_base<LicenseInfo,_std::allocator<LicenseInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    licenses_with_errors.super__Vector_base<LicenseInfo,_std::allocator<LicenseInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    licenses_with_errors.super__Vector_base<LicenseInfo,_std::allocator<LicenseInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    licenses_ok.super__Vector_base<LicenseInfo,_std::allocator<LicenseInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    licenses_ok.super__Vector_base<LicenseInfo,_std::allocator<LicenseInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    licenses_ok.super__Vector_base<LicenseInfo,_std::allocator<LicenseInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    license::LicenseVerifier::LicenseVerifier(&verifier,&er);
    for (licInfo = licenses.
                   super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        licInfo !=
        licenses.
        super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish; licInfo = licInfo + 1) {
      if (callerInformation != (CallerInformations *)0x0) {
        licInfo->m_magic = callerInformation->magic;
      }
      FVar1 = license::LicenseVerifier::verify_signature(&verifier,licInfo);
      license::LicenseVerifier::toLicenseInfo((LicenseInfo *)&evlog,&verifier,licInfo);
      pvVar5 = &licenses_with_errors;
      if (FVar1 == FUNC_RET_OK) {
        FVar1 = license::LicenseVerifier::verify_limits(&verifier,licInfo);
        pvVar5 = &licenses_ok;
        if (FVar1 != FUNC_RET_OK) {
          pvVar5 = &licenses_with_errors;
        }
      }
      std::vector<LicenseInfo,_std::allocator<LicenseInfo>_>::push_back(pvVar5,(value_type *)&evlog)
      ;
    }
    if (licenses_ok.super__Vector_base<LicenseInfo,_std::allocator<LicenseInfo>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        licenses_ok.super__Vector_base<LicenseInfo,_std::allocator<LicenseInfo>_>._M_impl.
        super__Vector_impl_data._M_start) {
      license::EventRegistry::turnWarningsIntoErrors(&er);
      pAVar3 = license::EventRegistry::getLastFailure(&er);
      LVar4 = pAVar3->event_type;
      pvVar5 = &licenses_with_errors;
    }
    else {
      license::EventRegistry::turnErrorsIntoWarnings(&er);
      LVar4 = LICENSE_OK;
      pvVar5 = &licenses_ok;
    }
    mergeLicenses(pvVar5,license_out);
    license::LicenseVerifier::~LicenseVerifier(&verifier);
    std::_Vector_base<LicenseInfo,_std::allocator<LicenseInfo>_>::~_Vector_base
              (&licenses_ok.super__Vector_base<LicenseInfo,_std::allocator<LicenseInfo>_>);
    std::_Vector_base<LicenseInfo,_std::allocator<LicenseInfo>_>::~_Vector_base
              (&licenses_with_errors.super__Vector_base<LicenseInfo,_std::allocator<LicenseInfo>_>);
  }
  license::EventRegistry::to_string_abi_cxx11_(&evlog,&er);
  _log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  if (license_out != (LicenseInfo *)0x0) {
    license::EventRegistry::exportLastEvents(&er,(AuditEvent_conflict *)license_out,5);
  }
  std::__cxx11::string::~string((string *)&evlog);
  license::EventRegistry::~EventRegistry(&er);
  std::__cxx11::string::~string((string *)&project);
  std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
            (&licenses);
  license::LicenseReader::~LicenseReader(&lr);
  return LVar4;
}

Assistant:

LCC_EVENT_TYPE acquire_license(const CallerInformations* callerInformation, const LicenseLocation* licenseLocation,
							   LicenseInfo* license_out) {
	const license::LicenseReader lr = license::LicenseReader(licenseLocation);
	vector<license::FullLicenseInfo> licenses;
	string project;
	size_t str_size;
	if (callerInformation != nullptr &&
		(str_size = license::mstrnlen_s(callerInformation->feature_name, sizeof callerInformation->feature_name)) > 0) {
		project = string(callerInformation->feature_name, str_size);
	} else {
		project = string(LCC_PROJECT_NAME);
	}
	license::EventRegistry er = lr.readLicenses(string(project), licenses);
	LCC_EVENT_TYPE result;
	if (licenses.size() > 0) {
		vector<LicenseInfo> licenses_with_errors;
		vector<LicenseInfo> licenses_ok;
		license::LicenseVerifier verifier(er);
		for (auto full_lic_info_it = licenses.begin(); full_lic_info_it != licenses.end(); full_lic_info_it++) {
			if (callerInformation != nullptr) {
				full_lic_info_it->m_magic = callerInformation->magic;
			}
			const FUNCTION_RETURN signatureValid = verifier.verify_signature(*full_lic_info_it);
			LicenseInfo licInfo = verifier.toLicenseInfo(*full_lic_info_it);
			if (signatureValid == FUNC_RET_OK) {
				if (verifier.verify_limits(*full_lic_info_it) == FUNC_RET_OK) {
					licenses_ok.push_back(licInfo);
				} else {
					licenses_with_errors.push_back(licInfo);
				}
			} else {
				licenses_with_errors.push_back(licInfo);
			}
		}
		if (licenses_ok.size() > 0) {
			er.turnErrorsIntoWarnings();
			result = LICENSE_OK;
			mergeLicenses(licenses_ok, license_out);
		} else {
			er.turnWarningsIntoErrors();
			result = er.getLastFailure()->event_type;
			mergeLicenses(licenses_with_errors, license_out);
		}
	} else {
		er.turnWarningsIntoErrors();
		result = er.getLastFailure()->event_type;
		if (license_out != nullptr) {
			license_out->proprietary_data[0] = '\0';
			license_out->linked_to_pc = false;
			license_out->days_left = 0;
		}
	}
#ifndef NDEBUG
	const string evlog = er.to_string();
	LOG_DEBUG("License status %s", evlog.c_str());
#endif

	if (license_out != nullptr) {
		er.exportLastEvents(license_out->status, LCC_API_AUDIT_EVENT_NUM);
	}
	return result;
}